

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choicfmt.cpp
# Opt level: O2

int32_t icu_63::ChoiceFormat::matchStringUntilLimitPart
                  (MessagePattern *pattern,int32_t partIndex,int32_t limitPartIndex,
                  UnicodeString *source,int32_t sourceOffset)

{
  uint16_t *puVar1;
  int8_t iVar2;
  Part *pPVar3;
  uint16_t *puVar4;
  long lVar5;
  int srcStart;
  int thisLength;
  int iVar6;
  
  pPVar3 = pattern->parts;
  lVar5 = (long)partIndex;
  srcStart = (uint)pPVar3[lVar5].length + pPVar3[lVar5].index;
  iVar6 = 0;
  do {
    puVar1 = &pPVar3[lVar5 + 1].length;
    do {
      puVar4 = puVar1;
      lVar5 = lVar5 + 1;
      if (lVar5 == limitPartIndex) break;
      puVar1 = puVar4 + 8;
    } while (((Part *)(puVar4 + -4))->type != UMSGPAT_PART_TYPE_SKIP_SYNTAX);
    thisLength = *(int *)(puVar4 + -2) - srcStart;
    if ((thisLength != 0) &&
       (iVar2 = icu_63::UnicodeString::doCompare
                          (source,sourceOffset,thisLength,&pattern->msg,srcStart,thisLength),
       iVar2 != '\0')) {
      return -1;
    }
    iVar6 = iVar6 + thisLength;
    if (lVar5 == limitPartIndex) {
      return iVar6;
    }
    srcStart = (uint)*puVar4 + *(int *)(puVar4 + -2);
    pPVar3 = pattern->parts;
  } while( true );
}

Assistant:

int32_t
ChoiceFormat::matchStringUntilLimitPart(
        const MessagePattern &pattern, int32_t partIndex, int32_t limitPartIndex,
        const UnicodeString &source, int32_t sourceOffset) {
    int32_t matchingSourceLength = 0;
    const UnicodeString &msgString = pattern.getPatternString();
    int32_t prevIndex = pattern.getPart(partIndex).getLimit();
    for (;;) {
        const MessagePattern::Part &part = pattern.getPart(++partIndex);
        if (partIndex == limitPartIndex || part.getType() == UMSGPAT_PART_TYPE_SKIP_SYNTAX) {
            int32_t index = part.getIndex();
            int32_t length = index - prevIndex;
            if (length != 0 && 0 != source.compare(sourceOffset, length, msgString, prevIndex, length)) {
                return -1;  // mismatch
            }
            matchingSourceLength += length;
            if (partIndex == limitPartIndex) {
                return matchingSourceLength;
            }
            prevIndex = part.getLimit();  // SKIP_SYNTAX
        }
    }
}